

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator--
          (type_of_iterator *__return_storage_ptr__,Roaring64MapSetBitBiDirectionalIterator *this,
          int param_1)

{
  const_iterator *this_00;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *pmVar1;
  _Base_ptr p_Var2;
  roaring_bitmap_t *prVar3;
  container_s *pcVar4;
  bool bVar5;
  undefined3 uVar6;
  int32_t iVar7;
  uint32_t uVar8;
  roaring_container_iterator_t rVar9;
  
  bVar5 = (this->i).has_value;
  uVar6 = *(undefined3 *)&(this->i).field_0x25;
  (__return_storage_ptr__->i).current_value = (this->i).current_value;
  (__return_storage_ptr__->i).has_value = bVar5;
  *(undefined3 *)&(__return_storage_ptr__->i).field_0x25 = uVar6;
  pmVar1 = this->p;
  p_Var2 = (this->map_iter)._M_node;
  prVar3 = (this->i).parent;
  pcVar4 = (this->i).container;
  uVar6 = *(undefined3 *)&(this->i).field_0x11;
  iVar7 = (this->i).container_index;
  uVar8 = (this->i).highbits;
  rVar9.index = (this->i).container_it.index;
  (__return_storage_ptr__->i).typecode = (this->i).typecode;
  *(undefined3 *)&(__return_storage_ptr__->i).field_0x11 = uVar6;
  (__return_storage_ptr__->i).container_index = iVar7;
  (__return_storage_ptr__->i).highbits = uVar8;
  (__return_storage_ptr__->i).container_it = (roaring_container_iterator_t)rVar9.index;
  (__return_storage_ptr__->i).parent = prVar3;
  (__return_storage_ptr__->i).container = pcVar4;
  __return_storage_ptr__->p = pmVar1;
  (__return_storage_ptr__->map_iter)._M_node = p_Var2;
  this_00 = &this->map_iter;
  if ((_Rb_tree_header *)(this->map_iter)._M_node == &(this->p->_M_t)._M_impl.super__Rb_tree_header)
  {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator--
              (this_00);
    roaring_iterator_init_last
              ((roaring_bitmap_t *)&(this->map_iter)._M_node[1]._M_parent,
               (roaring_uint32_iterator_t *)&this->i);
  }
  else {
    roaring_uint32_iterator_previous((roaring_uint32_iterator_t *)&this->i);
    while (((this->i).has_value == false &&
           ((this->map_iter)._M_node !=
            (this->p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left))) {
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator--
                (this_00,0);
      roaring_iterator_init_last
                ((roaring_bitmap_t *)&this_00->_M_node[1]._M_parent,
                 (roaring_uint32_iterator_t *)&this->i);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

type_of_iterator operator--(int) {  // i--, must return orig. value
        Roaring64MapSetBitBiDirectionalIterator orig(*this);
        if (map_iter == p->cend()) {
            --map_iter;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
            return orig;
        }

        roaring_uint32_iterator_previous(&i);
        while (!i.has_value) {
            if (map_iter == p->cbegin()) return orig;
            map_iter--;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
        }
        return orig;
    }